

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O2

Var Js::JavascriptFunction::CallFunction<true>
              (RecyclableObject *function,JavascriptMethod entryPoint,Arguments *args,
              bool useLargeArgCount)

{
  ScriptContext *scriptContext;
  ArgSlot AVar1;
  uint uVar2;
  Var pvVar3;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,useLargeArgCount) == 0) {
    AVar1 = CallInfo::GetArgCountWithExtraArgs(&args->Info);
    uVar2 = (uint)AVar1;
  }
  else {
    uVar2 = CallInfo::GetLargeArgCountWithExtraArgs(&args->Info);
  }
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,(ulong)(uVar2 * 8),function,scriptContext);
  CheckIsExecutable(function,entryPoint);
  ThreadContext::CheckAndResetReentrancySafeOrHandled
            (((((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
              scriptContext.ptr)->threadContext);
  ThreadContext::AssertJsReentrancy
            (((((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
              scriptContext.ptr)->threadContext);
  pvVar3 = (Var)amd64_CallFunction(function,entryPoint,args->Info,uVar2,args->Values);
  return pvVar3;
}

Assistant:

Var JavascriptFunction::CallFunction(RecyclableObject *function, JavascriptMethod entryPoint, Arguments args, bool useLargeArgCount)
    {
        // compute size of stack to reserve and make sure we have enough stack.
        uint argCount = useLargeArgCount ? args.GetLargeArgCountWithExtraArgs() : args.GetArgCountWithExtraArgs();
        uint argsSize = argCount * sizeof(Var);

        if (doStackProbe == true)
        {
            PROBE_STACK_CALL(function->GetScriptContext(), function, argsSize);
        }
#if DBG && ENABLE_NATIVE_CODEGEN
        CheckIsExecutable(function, entryPoint);
#endif

        return JS_REENTRANCY_CHECK(function->GetScriptContext()->GetThreadContext(),
            amd64_CallFunction(function, entryPoint, args.Info, argCount, &args.Values[0]));
    }